

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltimerquery.cpp
# Opt level: O2

void __thiscall QOpenGLTimeMonitor::QOpenGLTimeMonitor(QOpenGLTimeMonitor *this,QObject *parent)

{
  QOpenGLTimeMonitorPrivate *this_00;
  
  this_00 = (QOpenGLTimeMonitorPrivate *)operator_new(0xd0);
  QOpenGLTimeMonitorPrivate::QOpenGLTimeMonitorPrivate(this_00);
  QObject::QObject(&this->super_QObject,(QObjectPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_001a1fe0;
  return;
}

Assistant:

QOpenGLTimeMonitor::QOpenGLTimeMonitor(QObject *parent)
    : QObject(*new QOpenGLTimeMonitorPrivate, parent)
{
}